

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult tonk_socket_create(TonkSocketConfig *config,TonkSocket *socketOut,TonkJson *errorJsonOut)

{
  TonkResult TVar1;
  ErrorResult *pEVar2;
  long *plVar3;
  char *__src;
  char *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  TonkSocketConfig *in_stack_00000038;
  ApplicationSession *in_stack_00000040;
  int siameseResult;
  Result result;
  ApplicationSession *session;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined8 in_stack_fffffffffffffc38;
  ErrorType type;
  char *__dest;
  string *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  ErrorResult *in_stack_fffffffffffffc50;
  Result *in_stack_fffffffffffffc58;
  long *local_380;
  string local_2f0 [24];
  ApplicationSession *in_stack_fffffffffffffd28;
  ErrorResult *local_2d0;
  allocator local_2c1;
  string local_2c0 [32];
  undefined8 local_2a0;
  undefined1 local_291;
  long *local_290;
  ErrorResult *local_288;
  ErrorResult *local_280;
  ErrorResult *local_278;
  allocator local_269;
  string local_268 [32];
  undefined8 local_248;
  allocator local_239;
  string local_238 [32];
  undefined8 local_218 [3];
  allocator local_1f9;
  string local_1f8 [32];
  undefined8 local_1d8;
  int local_1cc;
  Result local_1c8;
  long *local_1c0;
  char *local_1b8;
  undefined8 *local_1b0;
  int *local_1a8;
  Result *local_1a0;
  undefined8 local_188;
  undefined4 local_17c;
  string *local_178;
  char *local_170;
  undefined8 *local_168;
  undefined8 local_150;
  undefined4 local_144;
  string *local_140;
  char *local_138;
  undefined8 *local_130;
  long local_118;
  undefined4 local_10c;
  string *local_108;
  char *local_100;
  undefined8 *local_f8;
  undefined8 local_e0;
  undefined4 local_d4;
  string *local_d0;
  char *local_c8;
  undefined8 *local_c0;
  ErrorResult **local_b8;
  Result *local_b0;
  undefined8 *local_a8;
  Result *local_a0;
  TonkSocketConfig *in_stack_ffffffffffffff68;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  local_1b8 = in_RDX;
  local_1b0 = in_RSI;
  local_1a8 = in_RDI;
  IncrementSessionCounter();
  local_1c0 = (long *)0x0;
  local_1a0 = &local_1c8;
  local_1c8.Error = (ErrorResult *)0x0;
  if ((local_1a8 == (int *)0x0) || (local_1b0 == (undefined8 *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Null parameter",&local_1f9);
    local_168 = &local_1d8;
    local_170 = "tonk_socket_create";
    local_178 = local_1f8;
    local_17c = 0;
    local_188 = 2;
    pEVar2 = (ErrorResult *)operator_new(0x38);
    tonk::ErrorResult::ErrorResult
              (in_stack_fffffffffffffc50,
               (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
               in_stack_fffffffffffffc40,type,
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    local_1d8 = 0;
    local_1c8.Error = pEVar2;
    tonk::Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  }
  else if (*local_1a8 == 9) {
    local_1cc = siamese_init_(0x12b05c);
    if (local_1cc == 0) {
      tonk::SecureRandom_Initialize();
      local_1c8.Error = local_278;
      local_278 = (ErrorResult *)0x0;
      tonk::Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30))
      ;
      if (local_1c8.Error == (ErrorResult *)0x0) {
        tonk::InitializeAddressHash();
        local_1c8.Error = local_280;
        local_280 = (ErrorResult *)0x0;
        tonk::Result::~Result
                  ((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        if (local_1c8.Error == (ErrorResult *)0x0) {
          ValidateTonkSocketConfig(in_stack_ffffffffffffff68);
          local_1c8.Error = local_288;
          tonk::Result::~Result
                    ((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          if (local_1c8.Error == (ErrorResult *)0x0) {
            plVar3 = (long *)operator_new(0x3ac8,(nothrow_t *)&std::nothrow);
            local_291 = 0;
            local_380 = (long *)0x0;
            if (plVar3 != (long *)0x0) {
              local_291 = 1;
              local_290 = plVar3;
              tonk::ApplicationSession::ApplicationSession(in_stack_fffffffffffffd28);
              local_380 = plVar3;
            }
            local_1c0 = local_380;
            if (local_380 == (long *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2c0,"Out of memory",&local_2c1);
              local_c0 = &local_2a0;
              local_c8 = "tonk_socket_create";
              local_d0 = local_2c0;
              local_d4 = 0;
              local_e0 = 2;
              pEVar2 = (ErrorResult *)operator_new(0x38);
              tonk::ErrorResult::ErrorResult
                        (in_stack_fffffffffffffc50,
                         (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                         in_stack_fffffffffffffc40,type,
                         CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
              local_a0 = &local_1c8;
              local_a8 = &local_2a0;
              local_2a0 = 0;
              local_1c8.Error = pEVar2;
              tonk::Result::~Result
                        ((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
              std::__cxx11::string::~string(local_2c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
            }
            else {
              tonk::ApplicationSession::Initialize(in_stack_00000040,in_stack_00000038);
              local_b0 = &local_1c8;
              local_b8 = &local_2d0;
              local_1c8.Error = local_2d0;
              tonk::Result::~Result
                        ((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
              if (local_1c8.Error != (ErrorResult *)0x0) {
                if (local_1c0 != (long *)0x0) {
                  (**(code **)(*local_1c0 + 8))();
                }
                local_1c0 = (long *)0x0;
              }
            }
          }
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"siamese_init failed",&local_269);
      local_118 = (long)local_1cc;
      local_f8 = &local_248;
      local_100 = "tonk_socket_create";
      local_108 = local_268;
      local_10c = 1;
      pEVar2 = (ErrorResult *)operator_new(0x38);
      tonk::ErrorResult::ErrorResult
                (in_stack_fffffffffffffc50,
                 (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                 in_stack_fffffffffffffc40,type,
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
      local_248 = 0;
      local_1c8.Error = pEVar2;
      tonk::Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30))
      ;
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_238,"config.Version does not match TONK_VERSION in header",&local_239);
    local_130 = local_218;
    local_138 = "tonk_socket_create";
    local_140 = local_238;
    local_144 = 0;
    local_150 = 1;
    pEVar2 = (ErrorResult *)operator_new(0x38);
    tonk::ErrorResult::ErrorResult
              (in_stack_fffffffffffffc50,
               (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
               in_stack_fffffffffffffc40,type,
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    local_218[0] = 0;
    local_1c8.Error = pEVar2;
    tonk::Result::~Result((Result *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
  }
  if (local_1b0 != (undefined8 *)0x0) {
    *local_1b0 = local_1c0;
  }
  if (local_1c0 == (long *)0x0) {
    DecrementSessionCounter();
  }
  if (local_1b8 != (char *)0x0) {
    tonk::Result::ToJson_abi_cxx11_(in_stack_fffffffffffffc58);
    __dest = local_1b8;
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(__dest,__src,0x400);
    __dest[0x3ff] = '\0';
    std::__cxx11::string::~string(local_2f0);
  }
  TVar1 = TonkResultFromDetailedResult(&local_1c8);
  tonk::Result::~Result((Result *)CONCAT44(TVar1,in_stack_fffffffffffffc30));
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_socket_create(
    const TonkSocketConfig* config, // Configuration for the socket
    TonkSocket*          socketOut, // Created socket, or 0 on failure
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    IncrementSessionCounter();

    ApplicationSession* session = nullptr;
    Result result;
    int siameseResult;

    if (!config || !socketOut)
    {
        result = Result("tonk_socket_create", "Null parameter");
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    if (config->Version != TONK_VERSION)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        result = Result("tonk_socket_create", "config.Version does not match TONK_VERSION in header", ErrorType::Tonk, Tonk_InvalidInput);
        goto OnError;
    }

    siameseResult = siamese_init();
    if (0 != siameseResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        result = Result("tonk_socket_create", "siamese_init failed", ErrorType::Siamese, siameseResult);
        goto OnError;
    }

    result = SecureRandom_Initialize();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Should never happen
        goto OnError;
    }

    result = InitializeAddressHash();
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // PRNG failed
        goto OnError;
    }

    result = ValidateTonkSocketConfig(config);
    if (result.IsFail())
    {
        TONK_DEBUG_BREAK(); // Invalid input
        goto OnError;
    }

    session = new (std::nothrow) ApplicationSession;
    if (!session)
    {
        TONK_DEBUG_BREAK(); // Out of memory
        result = Result("tonk_socket_create", "Out of memory");
        goto OnError;
    }

    result = session->Initialize(*config);
    if (result.IsFail())
    {
        delete session;
        session = nullptr;
        goto OnError;
    }

OnError:
    if (socketOut)
        *socketOut = reinterpret_cast<TonkSocket>(session);

    if (!session)
        DecrementSessionCounter();

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}